

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgenericunixtheme.cpp
# Opt level: O2

QPlatformTheme * QGenericUnixTheme::createUnixTheme(QString *name)

{
  bool bVar1;
  QPlatformTheme *this;
  long in_FS_OFFSET;
  QLatin1String QStack_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  QLatin1String::QLatin1String(&QStack_28,QGenericUnixTheme::name);
  bVar1 = ::operator==(name,&QStack_28);
  if (bVar1) {
    this = (QPlatformTheme *)operator_new(0x10);
    QGenericUnixTheme((QGenericUnixTheme *)this);
  }
  else {
    QLatin1String::QLatin1String(&QStack_28,QKdeTheme::name);
    bVar1 = ::operator==(name,&QStack_28);
    if (bVar1) {
      this = QKdeTheme::createKdeTheme();
    }
    else {
      QLatin1String::QLatin1String(&QStack_28,QGnomeTheme::name);
      bVar1 = ::operator==(name,&QStack_28);
      if (bVar1) {
        this = (QPlatformTheme *)operator_new(0x10);
        QGnomeTheme::QGnomeTheme((QGnomeTheme *)this);
      }
      else {
        this = (QPlatformTheme *)0x0;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return this;
  }
  __stack_chk_fail();
}

Assistant:

QPlatformTheme *QGenericUnixTheme::createUnixTheme(const QString &name)
{
    if (name == QLatin1StringView(QGenericUnixTheme::name))
        return new QGenericUnixTheme;
#if QT_CONFIG(dbus) && QT_CONFIG(settings) && (QT_CONFIG(xcb) || QT_CONFIG(wayland))
    if (name == QLatin1StringView(QKdeTheme::name))
        return QKdeTheme::createKdeTheme();
#endif
    if (name == QLatin1StringView(QGnomeTheme::name))
        return new QGnomeTheme;
    return nullptr;
}